

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_closed_fd_events(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_buf_t *buf;
  undefined1 *nread;
  uv_stream_t *stream;
  int64_t eval_b_1;
  int64_t eval_b_4;
  uv_os_fd_t fd [2];
  uv_fs_t req;
  uv_pipe_t pipe_handle;
  uv_stdio_container_t stdio [3];
  undefined1 local_320 [24];
  uv_buf_t local_308;
  uv_fs_t local_2f0;
  uv_pipe_t local_130;
  uv_stdio_container_t local_48;
  undefined4 local_38;
  undefined4 local_28;
  
  local_308 = uv_buf_init("",1);
  iVar1 = uv_pipe((uv_os_fd_t *)(local_320 + 0x10),0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &local_48;
    local_48.flags = UV_INHERIT_FD;
    local_48.data.file = local_320._16_4_;
    local_38 = 0;
    local_28 = 0;
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    local_2f0.data = (void *)(long)iVar1;
    local_130.data = (void *)0x0;
    if ((uv_handle_t *)local_2f0.data != (uv_handle_t *)0x0) goto LAB_001bfaf5;
    uv_unref((uv_handle_t *)&process);
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&local_130,0);
    local_2f0.data = (void *)(long)iVar1;
    local_320._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)local_2f0.data != (uv_handle_t *)0x0) goto LAB_001bfb07;
    iVar1 = uv_pipe_open(&local_130,local_320._16_4_);
    local_2f0.data = (void *)(long)iVar1;
    local_320._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)local_2f0.data != (uv_handle_t *)0x0) goto LAB_001bfb16;
    local_320._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start((uv_stream_t *)&local_130,on_alloc,on_read_once);
    local_2f0.data = (void *)(long)iVar1;
    local_320._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)local_2f0.data != (uv_handle_t *)0x0) goto LAB_001bfb25;
    local_320._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&local_2f0,local_320._20_4_,&local_308,1,-1,(uv_fs_cb)0x0);
    local_320._8_8_ = SEXT48(iVar1);
    if (local_320._0_8_ != local_320._8_8_) goto LAB_001bfb34;
    local_320._0_8_ = (uv_loop_t *)0x1;
    local_320._8_8_ = local_2f0.result;
    if ((uv_loop_t *)local_2f0.result != (uv_loop_t *)0x1) goto LAB_001bfb43;
    uv_fs_req_cleanup(&local_2f0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb52;
    local_320._0_8_ = (uv_loop_t *)0x1;
    local_320._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)local_320._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfb61;
    uv_close((uv_handle_t *)&local_130,close_cb);
    local_320._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&local_2f0,local_320._20_4_,&local_308,1,-1,(uv_fs_cb)0x0);
    local_320._8_8_ = SEXT48(iVar1);
    if (local_320._0_8_ != local_320._8_8_) goto LAB_001bfb70;
    local_320._0_8_ = (uv_loop_t *)0x1;
    local_320._8_8_ = local_2f0.result;
    if ((uv_loop_t *)local_2f0.result != (uv_loop_t *)0x1) goto LAB_001bfb7f;
    uv_fs_req_cleanup(&local_2f0);
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb8e;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb9d;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 1) {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_ONCE);
      local_320._0_8_ = SEXT48(iVar1);
      local_320._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbe8;
    }
    local_320._0_8_ = (uv_loop_t *)0x1;
    local_320._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)local_320._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfbac;
    iVar1 = uv_process_kill(&process,0xf);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbbb;
    iVar1 = close(local_320._20_4_);
    local_320._0_8_ = SEXT48(iVar1);
    local_320._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_320._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbca;
    local_320._20_4_ = -1;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_320._0_8_ = (uv_loop_t *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    local_320._8_8_ = SEXT48(iVar1);
    if (local_320._0_8_ == local_320._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001bfaf5:
    run_test_closed_fd_events_cold_2();
LAB_001bfb07:
    run_test_closed_fd_events_cold_3();
LAB_001bfb16:
    run_test_closed_fd_events_cold_4();
LAB_001bfb25:
    run_test_closed_fd_events_cold_5();
LAB_001bfb34:
    run_test_closed_fd_events_cold_6();
LAB_001bfb43:
    run_test_closed_fd_events_cold_7();
LAB_001bfb52:
    run_test_closed_fd_events_cold_8();
LAB_001bfb61:
    run_test_closed_fd_events_cold_9();
LAB_001bfb70:
    run_test_closed_fd_events_cold_10();
LAB_001bfb7f:
    run_test_closed_fd_events_cold_11();
LAB_001bfb8e:
    run_test_closed_fd_events_cold_12();
LAB_001bfb9d:
    run_test_closed_fd_events_cold_13();
LAB_001bfbac:
    run_test_closed_fd_events_cold_15();
LAB_001bfbbb:
    run_test_closed_fd_events_cold_16();
LAB_001bfbca:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001bfbe8:
  stream = (uv_stream_t *)local_320;
  nread = local_320 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop(stream);
  on_read(stream,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(closed_fd_events) {
  uv_stdio_container_t stdio[3];
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  uv_buf_t bufs[1];
  uv_os_fd_t fd[2];
  bufs[0] = uv_buf_init("", 1);

  /* create a pipe and share it with a child process */
  ASSERT(0 == uv_pipe(fd, 0, 0));

  /* spawn_helper4 blocks indefinitely. */
  init_process_options("spawn_helper4", exit_cb);
  options.stdio_count = 3;
  options.stdio = stdio;
  options.stdio[0].flags = UV_INHERIT_FD;
  options.stdio[0].data.file = fd[0];
  options.stdio[1].flags = UV_IGNORE;
  options.stdio[2].flags = UV_IGNORE;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  uv_unref((uv_handle_t*) &process);

  /* read from the pipe with uv */
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT_OK(uv_pipe_open(&pipe_handle, fd[0]));
  /* uv_pipe_open() takes ownership of the file descriptor. */
#ifdef _WIN32
  fd[0] = INVALID_HANDLE_VALUE;
#else
  fd[0] = -1;
#endif

  ASSERT_OK(uv_read_start((uv_stream_t*) &pipe_handle,
                          on_alloc,
                          on_read_once));

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));

  /* should have received just one byte */
  ASSERT_EQ(1, output_used);

  /* close the pipe and see if we still get events */
  uv_close((uv_handle_t*) &pipe_handle, close_cb);

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_counter_cb, 10, 0));

  /* see if any spurious events interrupt the timer */
  if (1 == uv_run(uv_default_loop(), UV_RUN_ONCE))
    /* have to run again to really trigger the timer */
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));

  ASSERT_EQ(1, timer_counter);

  /* cleanup */
  ASSERT_OK(uv_process_kill(&process, SIGTERM));
#ifdef _WIN32
  ASSERT_NE(0, CloseHandle(fd[1]));
  fd[1] = INVALID_HANDLE_VALUE;
#else
  ASSERT_OK(close(fd[1]));
  fd[1] = -1;
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}